

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O2

int I_GetTimePolled(bool saveMS)

{
  DWORD DVar1;
  
  if (TicFrozen != 0) {
    return TicFrozen;
  }
  DVar1 = SDL_GetTicks();
  if (saveMS) {
    TicStart = DVar1;
  }
  return (int)(((long)(int)(DVar1 - BaseTime) * 0x23) / 1000);
}

Assistant:

int I_GetTimePolled (bool saveMS)
{
	if (TicFrozen != 0)
	{
		return TicFrozen;
	}

	DWORD tm = SDL_GetTicks();

	if (saveMS)
	{
		TicStart = tm;
	}
	return Scale(tm - BaseTime, TICRATE, 1000);
}